

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  SetMB *set;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_2UL>
  *pHVar1;
  size_t *psVar2;
  atomic<unsigned_long> *paVar3;
  char *pcVar4;
  undefined8 uVar5;
  byte bVar6;
  PrimRefVector pmVar7;
  PrimRefVector pmVar8;
  PrimRefMB *pPVar9;
  MemoryMonitorInterface *pMVar10;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar11;
  PrimRefVector pmVar12;
  ThreadLocal2 *pTVar13;
  Split *pSVar14;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *pPVar15;
  vint *pvVar16;
  code *pcVar17;
  unsigned_long end_00;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar18 [16];
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar19;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar20;
  undefined1 auVar21 [16];
  char cVar22;
  size_t i_1;
  long *plVar23;
  MutexSys *this_00;
  size_t sVar24;
  BBox1f BVar25;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var26;
  void *pvVar27;
  runtime_error *prVar28;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar30;
  float *pfVar31;
  unsigned_long *puVar32;
  unsigned_long uVar33;
  size_t end;
  undefined1 *puVar34;
  char *pcVar35;
  ulong size;
  ulong uVar36;
  BBox1f *pBVar37;
  size_t sVar38;
  size_t i;
  size_t sVar39;
  size_t begin;
  SetMB *set_00;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  _Var40;
  long lVar41;
  BBox1f BVar42;
  BuildRecord *current_00;
  size_t i_4;
  BBox1f BVar43;
  bool bVar44;
  bool bVar45;
  uint uVar46;
  uint uVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1a48 [8];
  undefined8 uStack_1a40;
  undefined1 local_1a38 [8];
  undefined8 uStack_1a30;
  undefined1 local_1a28 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector_1;
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  undefined1 local_19e8 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_19c8;
  __uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  local_19c0;
  PrimRefVector lprims_1;
  PrimRefVector lprims;
  undefined8 local_19a8;
  undefined1 local_19a0 [8];
  vbool vSplitMask;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined1 local_1968 [120];
  ulong local_18f0;
  anon_class_24_3_c5d13451 isLeft;
  undefined8 uStack_18d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888 [4];
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1848;
  BBox1f time_range1;
  anon_class_1_0_00000001 reduction2_1;
  undefined1 local_17f8 [16];
  anon_class_1_0_00000001 reduction;
  unsigned_long local_1788;
  unsigned_long uStack_1780;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1748;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1738;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1728 [4];
  size_t local_16e8;
  size_t local_16e0;
  float local_16c0;
  float fStack_16bc;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_16b8;
  anon_class_1_0_00000001 reduction2;
  unsigned_long local_1648;
  unsigned_long local_1640;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_1610;
  uint uStack_160c;
  vint vSplitPos_1;
  Split csplit;
  SetMB local_1508;
  SetMB local_1468;
  LocalChildList_conflict children;
  NodeRecordMB4D values [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar23 = (long *)__tls_get_addr(&PTR_021f8d38);
    this_00 = (MutexSys *)*plVar23;
    if (this_00 == (MutexSys *)0x0) {
      this_00 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_00);
      this_00[1].mutex = (void *)0x0;
      this_00[8].mutex = this_00;
      this_00[9].mutex = (void *)0x0;
      this_00[10].mutex = (void *)0x0;
      this_00[0xb].mutex = (void *)0x0;
      this_00[0xc].mutex = (void *)0x0;
      this_00[0xd].mutex = (void *)0x0;
      this_00[0xe].mutex = (void *)0x0;
      this_00[0x10].mutex = this_00;
      this_00[0x11].mutex = (void *)0x0;
      this_00[0x12].mutex = (void *)0x0;
      this_00[0x13].mutex = (void *)0x0;
      this_00[0x14].mutex = (void *)0x0;
      this_00[0x15].mutex = (void *)0x0;
      this_00[0x16].mutex = (void *)0x0;
      *plVar23 = (long)this_00;
      children.children.items[0].depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0]._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)this_00;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)values);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
    }
    alloc.talloc0 = (ThreadLocal *)(this_00 + 8);
    alloc.talloc1 = (ThreadLocal *)(this_00 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     (sVar38 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     sVar38 <= (this->cfg).singleThreadThreshold)) {
    Scene::BuildProgressMonitorInterface::operator()(&this->progressMonitor,sVar38);
  }
  set = &current->prims;
  find(&csplit,this,set);
  bVar6 = (byte)(this->cfg).logBlockSize;
  sVar38 = (current->prims).super_PrimInfoMB.object_range._end;
  sVar39 = (current->prims).super_PrimInfoMB.object_range._begin;
  uVar36 = sVar38 - sVar39;
  if ((uVar36 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) {
LAB_004d1a5e:
    SetMB::deterministic_order(set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,current,alloc_00);
    return __return_storage_ptr__;
  }
  fVar59 = (current->prims).super_PrimInfoMB.time_range.upper;
  fVar48 = (current->prims).super_PrimInfoMB.time_range.lower;
  if ((uVar36 <= (this->cfg).maxLeafSize) &&
     (fVar49 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0.m128[1] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.lower.field_0.m128[1],
     fVar50 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds0.upper.field_0.m128[2] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds0.lower.field_0.m128[2],
     fVar51 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.upper.field_0.m128[1] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.lower.field_0.m128[1],
     fVar52 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.upper.field_0.m128[2] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds1.lower.field_0.m128[2],
     fVar50 = ((fVar51 + fVar52) *
               ((current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0.m128[0] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.lower.field_0.m128[0]) + fVar52 * fVar51 +
              (fVar49 + fVar50) *
              ((current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0.m128[0] -
              (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
              geomBounds.bounds0.lower.field_0.m128[0]) + fVar50 * fVar49) * 0.5 * (fVar59 - fVar48)
     , fVar49 = (this->cfg).intCost,
     (float)(~(-1L << (bVar6 & 0x3f)) + (current->prims).super_PrimInfoMB.num_time_segments >>
            (bVar6 & 0x3f)) * fVar50 * fVar49 <= fVar50 * (this->cfg).travCost + fVar49 * csplit.sah
     )) goto LAB_004d1a5e;
  switch(csplit.data) {
  case 0:
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = 0x3f800000;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ = 1.0;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0.0;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_8_ = 0xff800000ff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    values[1].lbounds.bounds0.upper.field_0._4_8_ = 0x3f8000003f800000;
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    isLeft.vSplitPos = &vSplitPos;
    vSplitPos.field_0.i[1] = csplit.field_2.pos;
    vSplitPos.field_0.i[0] = (int)csplit.field_2;
    vSplitPos.field_0.i[3] = csplit.field_2.pos;
    vSplitPos.field_0.i[2] = (int)csplit.field_2;
    lVar41 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar41);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar41 + 8);
    isLeft.vSplitMask = &vSplitMask;
    isLeft.split = &csplit;
    sVar24 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                       (((current->prims).prims)->items,sVar39,sVar38,(EmptyTy *)&vSplitPos_1,
                        (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
                        (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,&reduction,
                        &reduction2,0x80,0xc00);
    pmVar7 = (current->prims).prims;
    BVar25 = (current->prims).super_PrimInfoMB.time_range;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&local_1468.super_PrimInfoMB,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children
              );
    local_1a48._0_4_ = BVar25.lower;
    local_1a48._4_4_ = BVar25.upper;
    uVar46 = -(uint)(local_1468.super_PrimInfoMB.time_range.lower < (float)local_1a48._0_4_);
    uVar47 = -(uint)(local_1468.super_PrimInfoMB.time_range.upper < (float)local_1a48._4_4_);
    local_1468.super_PrimInfoMB.time_range =
         (BBox1f)(CONCAT44(~uVar47 & local_1a48._4_4_,
                           ~uVar46 & (uint)local_1468.super_PrimInfoMB.time_range.lower) |
                 CONCAT44((uint)local_1468.super_PrimInfoMB.time_range.upper & uVar47,
                          local_1a48._0_4_ & uVar46));
    pmVar8 = (current->prims).prims;
    BVar25 = (current->prims).super_PrimInfoMB.time_range;
    local_1468.super_PrimInfoMB.object_range._begin = sVar39;
    local_1468.super_PrimInfoMB.object_range._end = sVar24;
    local_1468.prims = pmVar7;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&local_1508.super_PrimInfoMB,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values);
    local_1a48._0_4_ = BVar25.lower;
    local_1a48._4_4_ = BVar25.upper;
    local_1508.super_PrimInfoMB.time_range.lower =
         (float)(~-(uint)(local_1508.super_PrimInfoMB.time_range.lower < (float)local_1a48._0_4_) &
                 (uint)local_1508.super_PrimInfoMB.time_range.lower |
                local_1a48._0_4_ &
                -(uint)(local_1508.super_PrimInfoMB.time_range.lower < (float)local_1a48._0_4_));
    local_1508.super_PrimInfoMB.time_range.upper =
         (float)(~-(uint)(local_1508.super_PrimInfoMB.time_range.upper < (float)local_1a48._4_4_) &
                 local_1a48._4_4_ |
                (uint)local_1508.super_PrimInfoMB.time_range.upper &
                -(uint)(local_1508.super_PrimInfoMB.time_range.upper < (float)local_1a48._4_4_));
    local_1508.super_PrimInfoMB.object_range._begin = sVar24;
    local_1508.super_PrimInfoMB.object_range._end = sVar38;
    local_1508.prims = pmVar8;
    break;
  case 1:
    SetMB::deterministic_order(set);
    splitFallback(this,set,&local_1468,&local_1508);
    break;
  case 2:
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = fVar59;
    time_range1.lower = csplit.field_2.fpos;
    BVar25 = (BBox1f)(current->prims).prims;
    time_range0.lower = fVar48;
    _Var26.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )::operator_new(0x28);
    pMVar10 = (this->heuristicTemporalSplit).device;
    *(MemoryMonitorInterface **)
     _Var26.
     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     .
     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
     ._M_head_impl = pMVar10;
    *(undefined1 *)
     ((long)_Var26.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl + 8) = 0;
    size = uVar36 * 0x50;
    *(long *)((long)_Var26.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x10) = 0;
    *(long *)((long)_Var26.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x18) = 0;
    *(long *)((long)_Var26.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x20) = 0;
    (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,size,0);
    if (size < 0x1c00000) {
      pvVar27 = alignedMalloc(size,0x10);
    }
    else {
      pvVar27 = os_malloc(size,(bool *)((long)_Var26.
                                              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                              .
                                              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                              ._M_head_impl + 8));
    }
    local_1988._0_8_ = &this->heuristicTemporalSplit;
    *(void **)((long)_Var26.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x20) = pvVar27;
    *(ulong *)((long)_Var26.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x10) = uVar36;
    *(ulong *)((long)_Var26.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x18) = uVar36;
    local_1988._8_8_ = &lprims;
    pSVar14 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pvVar16 = (vint *)(current->prims).super_PrimInfoMB.object_range._end;
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = 0x3f800000;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ = 1.0;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0.0;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )_Var26.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    lprims = (PrimRefVector)
             _Var26.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    vSplitMask.field_0._0_8_ = BVar25;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar16 - (long)pSVar14) < 0xc00) {
      isLeft.split = pSVar14;
      isLeft.vSplitPos = pvVar16;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)values,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
      local_1748._0_8_ = 0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      vSplitPos.field_0.v[0] = (longlong)pvVar16;
      vSplitPos.field_0.v[1] = (longlong)pSVar14;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)&children,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,(task_group_context *)this);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar22 != '\0') {
        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar28,"task cancelled");
        __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    }
    uVar33 = (current->prims).super_PrimInfoMB.object_range._end -
             (current->prims).super_PrimInfoMB.object_range._begin;
    if (values[1]._8_8_ - values[1].ref.ptr != uVar33) {
      children.children.items[0].depth = (size_t)&time_range0;
      values[1]._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                     (lprims->items,0,uVar33,0x400,(anon_class_8_1_41ce32a5 *)&children);
    }
    fVar48 = time_range0.upper;
    fVar59 = time_range0.lower;
    pmVar12 = lprims;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values);
    children.children.items[0].prims.super_PrimInfoMB.max_time_range = (BBox1f)pmVar12;
    uVar46 = -(uint)((float)children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments
                    < fVar59);
    uVar47 = -(uint)(children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ <
                    fVar48);
    uVar36 = CONCAT44(~uVar47 & (uint)fVar48,
                      ~uVar46 & (uint)(float)children.children.items[0].prims.super_PrimInfoMB.
                                             max_num_time_segments) |
             CONCAT44((uint)children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments.
                            _4_4_ & uVar47,(uint)fVar59 & uVar46);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ = (float)uVar36;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ =
         (float)(uVar36 >> 0x20);
    SetMB::operator=(&local_1468,(SetMB *)&children);
    uVar33 = (current->prims).super_PrimInfoMB.object_range._begin;
    pcVar17 = (code *)(current->prims).super_PrimInfoMB.object_range._end;
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0._0_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0._8_8_ = 0xff800000ff800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = 0x3f800000;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ = 1.0;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0.0;
    _reduction2 = BVar25;
    if ((long)pcVar17 - uVar33 < 0xc00) {
      vSplitPos.field_0.v[0] = uVar33;
      vSplitPos.field_0.v[1] = (longlong)pcVar17;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      _reduction = pcVar17;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&children,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,(task_group_context *)this);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar22 != '\0') {
        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar28,"task cancelled");
        __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
    }
    uVar33 = (current->prims).super_PrimInfoMB.object_range._begin;
    end_00 = (current->prims).super_PrimInfoMB.object_range._end;
    if (local_1888[0]._8_8_ - local_1888[0]._0_8_ != end_00 - uVar33) {
      children.children.items[0].depth = (size_t)&time_range1;
      parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                ((PrimRefMB *)
                 ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar25 + 0x20))->reduction,uVar33,
                 end_00,0x400,(anon_class_8_1_41ce32a6 *)&children);
    }
    BVar42 = time_range1;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
    local_1a48._0_4_ = BVar42.lower;
    local_1a48._4_4_ = BVar42.upper;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (float)(~-(uint)((float)children.children.items[0].prims.super_PrimInfoMB.
                                 max_num_time_segments < (float)local_1a48._0_4_) &
                 (uint)(float)children.children.items[0].prims.super_PrimInfoMB.
                              max_num_time_segments |
                local_1a48._0_4_ &
                -(uint)((float)children.children.items[0].prims.super_PrimInfoMB.
                               max_num_time_segments < (float)local_1a48._0_4_));
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ =
         (float)(~-(uint)(children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments.
                          _4_4_ < (float)local_1a48._4_4_) & local_1a48._4_4_ |
                (uint)children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_
                & -(uint)(children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments.
                          _4_4_ < (float)local_1a48._4_4_));
    children.children.items[0].prims.super_PrimInfoMB.max_time_range = BVar25;
    SetMB::operator=(&local_1508,(SetMB *)&children);
    bVar45 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )new_vector._M_t.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl !=
             (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
    local_1978._0_8_ = set;
    goto LAB_004d1d25;
  case 3:
    SetMB::deterministic_order(set);
    splitByGeometry(this,set,&local_1468,&local_1508);
  }
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  bVar45 = false;
LAB_004d1d25:
  children.numChildren = 1;
  local_18f0 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecord::operator=((BuildRecord *)&children,current);
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  children.sharedPrimVecs.items[0].prims = (current->prims).prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  isLeft.split = (Split *)(current->depth + 1);
  SetMB::SetMB((SetMB *)&isLeft.vSplitMask,&local_1468);
  vSplitPos.field_0.v[0] = current->depth + 1;
  SetMB::SetMB((SetMB *)&local_1748.field_1,&local_1508);
  sVar38 = children.numSharedPrimVecs;
  pSVar11 = children.primvecs.items[0];
  local_19c0._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )new_vector._M_t.
           super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           .
           super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
           ._M_head_impl;
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  if (local_1848 == children.primvecs.items[0]->prims) {
    children.primvecs.items[0]->refCount = children.primvecs.items[0]->refCount + 1;
    pvVar29 = local_1848;
  }
  else {
    pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    pSVar20 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
    pSVar20->prims = local_1848;
    children.sharedPrimVecs.items[sVar38].refCount = 1;
    pvVar29 = children.primvecs.items[0]->prims;
    children.primvecs.items[0] =
         (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
          *)&pSVar19->prims;
  }
  sVar38 = children.numSharedPrimVecs;
  if (local_16b8 == pvVar29) {
    children.primvecs.items[children.numChildren] = pSVar11;
    sVar38 = pSVar11->refCount;
    pSVar11->refCount = sVar38 + 1;
  }
  else {
    pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    pSVar20 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
    pSVar20->prims = local_16b8;
    children.sharedPrimVecs.items[sVar38].refCount = 1;
    children.primvecs.items[children.numChildren] =
         (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
          *)&pSVar19->prims;
    sVar38 = pSVar11->refCount - 1;
  }
  pSVar11->refCount = sVar38;
  if (sVar38 == 0) {
    pvVar29 = pSVar11->prims;
    if (pvVar29 !=
        (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
         *)0x0) {
      sVar38 = pvVar29->size_alloced;
      pPVar9 = pvVar29->items;
      if (pPVar9 != (PrimRefMB *)0x0) {
        if (sVar38 * 0x50 < 0x1c00000) {
          alignedFree(pPVar9);
        }
        else {
          os_free(pPVar9,sVar38 * 0x50,(pvVar29->alloc).hugepages);
        }
      }
      if (sVar38 != 0) {
        pMVar10 = (pvVar29->alloc).device;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar38 * -0x50,1);
      }
      pvVar29->size_active = 0;
      pvVar29->size_alloced = 0;
      pvVar29->items = (PrimRefMB *)0x0;
    }
    ::operator_delete(pvVar29);
  }
  local_19c0._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  BuildRecord::operator=((BuildRecord *)&children,(BuildRecord *)&isLeft);
  BuildRecord::operator=
            ((BuildRecord *)&children.children.items[children.numChildren].depth,
             (BuildRecord *)&vSplitPos);
  children.numChildren = children.numChildren + 1;
  std::
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 *)&local_19c0);
  pHVar1 = &this->heuristicTemporalSplit;
  uStack_1a40 = 0x7f8000007f800000;
  local_1a48 = (undefined1  [8])0x7f8000007f800000;
  local_19e8._8_8_ = 0xff800000ff800000;
  local_19e8._0_8_ = 0xff800000ff800000;
  while (children.numChildren < (this->cfg).branchingFactor) {
    puVar32 = &children.children.items[0].prims.super_PrimInfoMB.object_range._end;
    sVar38 = 0xffffffffffffffff;
    fVar59 = -INFINITY;
    for (sVar39 = 0; children.numChildren != sVar39; sVar39 = sVar39 + 1) {
      if (((this->cfg).minLeafSize < *puVar32 - ((range<unsigned_long> *)(puVar32 + -1))->_begin) &&
         (fVar49 = *(float *)((long)puVar32 + -0x54) - *(float *)((long)puVar32 + -100),
         fVar48 = *(float *)((long)puVar32 + -0x34) - *(float *)((long)puVar32 + -0x44),
         fVar48 = ((*(float *)(puVar32 + -7) - *(float *)(puVar32 + -9)) *
                   (fVar48 + (*(float *)(puVar32 + -6) - *(float *)(puVar32 + -8))) +
                   (*(float *)(puVar32 + -6) - *(float *)(puVar32 + -8)) * fVar48 +
                  (*(float *)(puVar32 + -0xb) - *(float *)(puVar32 + -0xd)) *
                  (fVar49 + (*(float *)(puVar32 + -10) - *(float *)(puVar32 + -0xc))) +
                  (*(float *)(puVar32 + -10) - *(float *)(puVar32 + -0xc)) * fVar49) * 0.5,
         fVar59 < fVar48)) {
        sVar38 = sVar39;
        fVar59 = fVar48;
      }
      puVar32 = puVar32 + 0x16;
    }
    if (sVar38 == 0xffffffffffffffff) break;
    lVar41 = sVar38 * 0xb0;
    isLeft.split = (Split *)(current->depth + 1);
    set_00 = &children.children.items[sVar38].prims;
    vSplitPos.field_0.v[0] = (longlong)isLeft.split;
    find((Split *)&time_range0,this,set_00);
    switch(uStack_160c) {
    case 0:
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      local_1988._0_8_ = (LocalChildList_conflict *)0xff800000ff800000;
      local_1988._8_8_ = (PrimRefVector *)0xff800000ff800000;
      local_1978._0_8_ = (SetMB *)0x7f8000007f800000;
      local_1978._8_8_ = 0x7f8000007f800000;
      local_1968._0_8_ = 0xff800000ff800000;
      local_1968._8_8_ = 0xff800000ff800000;
      _reduction = (code *)0x7f8000007f800000;
      local_1788 = 0;
      uStack_1780 = 0;
      sVar39 = children.children.items[sVar38].prims.super_PrimInfoMB.object_range._end;
      vSplitPos_1.field_0.i[1] = local_1610.pos;
      vSplitPos_1.field_0.i[0] = (int)local_1610;
      vSplitPos_1.field_0.i[3] = local_1610.pos;
      vSplitPos_1.field_0.i[2] = (int)local_1610;
      time_range1 = *(BBox1f *)
                     (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
      _reduction2 = &time_range0;
      sVar24 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)(*(long *)((long)values + lVar41 + -0xcf0) + 0x20),
                          children.children.items[sVar38].prims.super_PrimInfoMB.object_range._begin
                          ,sVar39,(EmptyTy *)local_17f8,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                          (anon_class_24_3_c5d13451 *)&reduction2,(anon_class_1_0_00000001 *)&lprims
                          ,&reduction2_1,0x80,0xc00);
      local_1848 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar41 + -0xcf0);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft.vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask);
      pvVar29 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  **)((long)values + lVar41 + -0xcf0);
      uVar5 = *(undefined8 *)((long)values + lVar41 + -0xcf8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1748.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction);
      local_1a38._0_4_ = (undefined4)uVar5;
      local_1a38._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      local_16c0 = (float)(~-(uint)(local_16c0 < (float)local_1a38._0_4_) & (uint)local_16c0 |
                          local_1a38._0_4_ & -(uint)(local_16c0 < (float)local_1a38._0_4_));
      fStack_16bc = (float)(~-(uint)(fStack_16bc < (float)local_1a38._4_4_) & local_1a38._4_4_ |
                           (uint)fStack_16bc & -(uint)(fStack_16bc < (float)local_1a38._4_4_));
      local_16e8 = sVar24;
      local_16e0 = sVar39;
      local_16b8 = pvVar29;
      break;
    case 1:
      SetMB::deterministic_order(set_00);
      splitFallback(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1748.field_1);
      break;
    case 2:
      time_range0_1.lower = *(float *)((long)values + lVar41 + -0xcf8);
      time_range1_1.upper = *(float *)((long)values + lVar41 + -0xcf4);
      BVar25 = *(BBox1f *)((long)values + lVar41 + -0xcf0);
      _Var26.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar10 = pHVar1->device;
      *(long *)((long)_Var26.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      BVar42 = (BBox1f)children.children.items[sVar38].prims.super_PrimInfoMB.object_range._end;
      uVar33 = children.children.items[sVar38].prims.super_PrimInfoMB.object_range._begin;
      *(MemoryMonitorInterface **)
       _Var26.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar10;
      *(undefined1 *)
       ((long)_Var26.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var26.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var26.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar41 = (long)BVar42 - uVar33;
      BVar43 = BVar42;
      if (lVar41 != 0) {
        uVar36 = lVar41 * 0x50;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar36,0);
        if (uVar36 < 0x1c00000) {
          pvVar27 = alignedMalloc(uVar36,0x10);
        }
        else {
          pvVar27 = os_malloc(uVar36,(bool *)((long)_Var26.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var26.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar27;
        *(long *)((long)_Var26.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar41;
        *(long *)((long)_Var26.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar41;
        BVar43 = (BBox1f)children.children.items[sVar38].prims.super_PrimInfoMB.object_range._begin;
        BVar42 = (BBox1f)children.children.items[sVar38].prims.super_PrimInfoMB.object_range._end;
      }
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      new_vector_1._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var26.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims_1 = (PrimRefVector)
                 _Var26.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl;
      time_range1 = BVar25;
      if ((ulong)((long)BVar42 - (long)BVar43) < 0xc00) {
        _reduction2 = BVar43;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&reduction,(anon_class_40_5_808acc65 *)&time_range1,
                   (range<unsigned_long> *)&reduction2);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&reduction2,(context_traits)0x4,CUSTOM_CTX);
        lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19a8 = &time_range1;
        vSplitPos_1.field_0.v[0] = (longlong)BVar42;
        vSplitPos_1.field_0.v[1] = (longlong)BVar43;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&vSplitPos_1,
                   (blocked_range<unsigned_long> *)&vSplitMask,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&reduction2,(task_group_context *)this);
        cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&reduction2);
        if (cVar22 != '\0') {
          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar28,"task cancelled");
          __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&reduction2);
      }
      uVar33 = children.children.items[sVar38].prims.super_PrimInfoMB.object_range._end -
               children.children.items[sVar38].prims.super_PrimInfoMB.object_range._begin;
      if (uStack_1780 - local_1788 != uVar33) {
        vSplitMask.field_0._0_8_ = &time_range0_1;
        uStack_1780 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                (lprims_1->items,0,uVar33,0x400,
                                 (anon_class_8_1_41ce32a5 *)&vSplitMask);
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction);
      SetMB::operator=((SetMB *)&isLeft.vSplitMask,(SetMB *)&vSplitMask);
      pBVar37 = (BBox1f *)children.children.items[sVar38].prims.super_PrimInfoMB.object_range._begin
      ;
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      local_1988._0_8_ = (LocalChildList_conflict *)0xff800000ff800000;
      local_1988._8_8_ = (PrimRefVector *)0xff800000ff800000;
      local_1978._0_8_ = (SetMB *)0x7f8000007f800000;
      local_1978._8_8_ = 0x7f8000007f800000;
      local_1968._0_8_ = 0xff800000ff800000;
      local_1968._8_8_ = 0xff800000ff800000;
      pmVar12 = (PrimRefVector)
                children.children.items[sVar38].prims.super_PrimInfoMB.object_range._end;
      _reduction2_1 = BVar25;
      if ((ulong)((long)pmVar12 - (long)pBVar37) < 0xc00) {
        vSplitPos_1.field_0.v[0] = (longlong)pBVar37;
        vSplitPos_1.field_0.v[1] = (longlong)pmVar12;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&reduction2,(anon_class_24_3_35f68c7c *)&reduction2_1,
                   (range<unsigned_long> *)&vSplitPos_1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos_1,(context_traits)0x4,CUSTOM_CTX);
        local_19a0 = (undefined1  [8])0x80;
        local_17f8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_17f8._8_8_ = &reduction2_1;
        lprims = pmVar12;
        local_19a8 = pBVar37;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction2,(d1 *)&lprims,
                   (blocked_range<unsigned_long> *)&vSplitMask,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_17f8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos_1,(task_group_context *)this);
        cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos_1);
        if (cVar22 != '\0') {
          prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar28,"task cancelled");
          __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos_1)
        ;
      }
      lVar41 = local_1640 - local_1648;
      local_1648 = children.children.items[sVar38].prims.super_PrimInfoMB.object_range._begin;
      local_1640 = lVar41 + local_1648;
      uVar33 = children.children.items[sVar38].prims.super_PrimInfoMB.object_range._end;
      if (lVar41 != uVar33 - local_1648) {
        vSplitMask.field_0._0_8_ = &time_range1_1;
        local_1640 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (*(PrimRefMB **)((long)BVar25 + 0x20),local_1648,uVar33,0x400,
                                (anon_class_8_1_41ce32a6 *)&vSplitMask);
      }
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction2);
      SetMB::operator=((SetMB *)&local_1748.field_1,(SetMB *)&vSplitMask);
      _Var40._M_head_impl =
           (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
            *)new_vector_1;
      goto LAB_004d232e;
    case 3:
      SetMB::deterministic_order(set_00);
      splitByGeometry(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1748.field_1);
      break;
    default:
      _Var40._M_head_impl =
           (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
            *)0x0;
      goto LAB_004d232e;
    }
    _Var40._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
LAB_004d232e:
    sVar39 = children.numSharedPrimVecs;
    new_vector_1._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar11 = children.primvecs.items[sVar38];
    if (local_1848 == pSVar11->prims) {
      pSVar11->refCount = pSVar11->refCount + 1;
      pvVar29 = local_1848;
    }
    else {
      pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar20 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar20->prims = local_1848;
      children.sharedPrimVecs.items[sVar39].refCount = 1;
      children.primvecs.items[sVar38] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar19->prims;
      pvVar29 = pSVar11->prims;
    }
    sVar39 = children.numSharedPrimVecs;
    if (local_16b8 == pvVar29) {
      children.primvecs.items[children.numChildren] = pSVar11;
      sVar39 = pSVar11->refCount;
      pSVar11->refCount = sVar39 + 1;
    }
    else {
      pSVar19 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar20 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar20->prims = local_16b8;
      children.sharedPrimVecs.items[sVar39].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar19->prims;
      sVar39 = pSVar11->refCount - 1;
    }
    pSVar11->refCount = sVar39;
    if (sVar39 == 0) {
      pvVar29 = pSVar11->prims;
      local_19c8._M_head_impl = _Var40._M_head_impl;
      if (pvVar29 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar39 = pvVar29->size_alloced;
        pPVar9 = pvVar29->items;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar39 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar39 * 0x50,(pvVar29->alloc).hugepages);
          }
        }
        if (sVar39 != 0) {
          pMVar10 = (pvVar29->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar39 * -0x50,1);
        }
        pvVar29->size_active = 0;
        pvVar29->size_alloced = 0;
        pvVar29->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar29);
    }
    local_19c8._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecord::operator=
              ((BuildRecord *)&children.children.items[sVar38].depth,(BuildRecord *)&isLeft);
    BuildRecord::operator=
              ((BuildRecord *)&children.children.items[children.numChildren].depth,
               (BuildRecord *)&vSplitPos);
    children.numChildren = children.numChildren + 1;
    bVar45 = (bool)(bVar45 | (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                              )_Var40._M_head_impl !=
                             (_Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                              )0x0);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_19c8);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector_1);
  }
  pfVar31 = &children.children.items[0].prims.super_PrimInfoMB.time_range.upper;
  sVar38 = children.numChildren;
  while (bVar44 = sVar38 != 0, sVar38 = sVar38 - 1, bVar44) {
    bVar45 = (bool)(bVar45 | (*pfVar31 < (current->prims).super_PrimInfoMB.time_range.upper ||
                             (current->prims).super_PrimInfoMB.time_range.lower <
                             ((BBox1f *)(pfVar31 + -1))->lower));
    pfVar31 = pfVar31 + 0x2c;
  }
  if (!bVar45) {
    _reduction = (code *)&DAT_000000e0;
    pTVar13 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar3 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar13->alloc0).bytesUsed = 0;
      (pTVar13->alloc0).bytesWasted = 0;
      (pTVar13->alloc0).end = 0;
      (pTVar13->alloc0).allocBlockSize = 0;
      (pTVar13->alloc0).ptr = (char *)0x0;
      (pTVar13->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).bytesUsed = 0;
        (pTVar13->alloc1).bytesWasted = 0;
        (pTVar13->alloc1).end = 0;
        (pTVar13->alloc1).allocBlockSize = 0;
        (pTVar13->alloc1).ptr = (char *)0x0;
        (pTVar13->alloc1).cur = 0;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)0x0;
        (pTVar13->alloc1).cur = 0;
        (pTVar13->alloc1).end = 0;
        (pTVar13->alloc1).allocBlockSize = 0;
        (pTVar13->alloc1).bytesUsed = 0;
        (pTVar13->alloc1).bytesWasted = 0;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar13;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vSplitMask);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&isLeft);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vSplitPos);
    }
    (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + (long)_reduction);
    sVar38 = (alloc.talloc0)->cur;
    uVar36 = (ulong)(-(int)sVar38 & 0xf);
    puVar34 = (undefined1 *)(sVar38 + (long)_reduction) + uVar36;
    (alloc.talloc0)->cur = (size_t)puVar34;
    if ((undefined1 *)(alloc.talloc0)->end < puVar34) {
      (alloc.talloc0)->cur = sVar38;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar35 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar35 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar35;
        sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar38;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar35 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar35;
          sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar38;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar35 = (char *)0x0;
            goto LAB_004d2efc;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar38;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar36;
      pcVar35 = (alloc.talloc0)->ptr + ((long)puVar34 - (long)_reduction);
    }
LAB_004d2efc:
    pcVar35[0x60] = '\0';
    pcVar35[0x61] = '\0';
    pcVar35[0x62] = -0x80;
    pcVar35[99] = '\x7f';
    pcVar35[100] = '\0';
    pcVar35[0x65] = '\0';
    pcVar35[0x66] = -0x80;
    pcVar35[0x67] = '\x7f';
    pcVar35[0x68] = '\0';
    pcVar35[0x69] = '\0';
    pcVar35[0x6a] = -0x80;
    pcVar35[0x6b] = '\x7f';
    pcVar35[0x6c] = '\0';
    pcVar35[0x6d] = '\0';
    pcVar35[0x6e] = -0x80;
    pcVar35[0x6f] = '\x7f';
    pcVar35[0x40] = '\0';
    pcVar35[0x41] = '\0';
    pcVar35[0x42] = -0x80;
    pcVar35[0x43] = '\x7f';
    pcVar35[0x44] = '\0';
    pcVar35[0x45] = '\0';
    pcVar35[0x46] = -0x80;
    pcVar35[0x47] = '\x7f';
    pcVar35[0x48] = '\0';
    pcVar35[0x49] = '\0';
    pcVar35[0x4a] = -0x80;
    pcVar35[0x4b] = '\x7f';
    pcVar35[0x4c] = '\0';
    pcVar35[0x4d] = '\0';
    pcVar35[0x4e] = -0x80;
    pcVar35[0x4f] = '\x7f';
    pcVar35[0x20] = '\0';
    pcVar35[0x21] = '\0';
    pcVar35[0x22] = -0x80;
    pcVar35[0x23] = '\x7f';
    pcVar35[0x24] = '\0';
    pcVar35[0x25] = '\0';
    pcVar35[0x26] = -0x80;
    pcVar35[0x27] = '\x7f';
    pcVar35[0x28] = '\0';
    pcVar35[0x29] = '\0';
    pcVar35[0x2a] = -0x80;
    pcVar35[0x2b] = '\x7f';
    pcVar35[0x2c] = '\0';
    pcVar35[0x2d] = '\0';
    pcVar35[0x2e] = -0x80;
    pcVar35[0x2f] = '\x7f';
    pcVar35[0x70] = '\0';
    pcVar35[0x71] = '\0';
    pcVar35[0x72] = -0x80;
    pcVar35[0x73] = -1;
    pcVar35[0x74] = '\0';
    pcVar35[0x75] = '\0';
    pcVar35[0x76] = -0x80;
    pcVar35[0x77] = -1;
    pcVar35[0x78] = '\0';
    pcVar35[0x79] = '\0';
    pcVar35[0x7a] = -0x80;
    pcVar35[0x7b] = -1;
    pcVar35[0x7c] = '\0';
    pcVar35[0x7d] = '\0';
    pcVar35[0x7e] = -0x80;
    pcVar35[0x7f] = -1;
    pcVar35[0x50] = '\0';
    pcVar35[0x51] = '\0';
    pcVar35[0x52] = -0x80;
    pcVar35[0x53] = -1;
    pcVar35[0x54] = '\0';
    pcVar35[0x55] = '\0';
    pcVar35[0x56] = -0x80;
    pcVar35[0x57] = -1;
    pcVar35[0x58] = '\0';
    pcVar35[0x59] = '\0';
    pcVar35[0x5a] = -0x80;
    pcVar35[0x5b] = -1;
    pcVar35[0x5c] = '\0';
    pcVar35[0x5d] = '\0';
    pcVar35[0x5e] = -0x80;
    pcVar35[0x5f] = -1;
    pcVar35[0x30] = '\0';
    pcVar35[0x31] = '\0';
    pcVar35[0x32] = -0x80;
    pcVar35[0x33] = -1;
    pcVar35[0x34] = '\0';
    pcVar35[0x35] = '\0';
    pcVar35[0x36] = -0x80;
    pcVar35[0x37] = -1;
    pcVar35[0x38] = '\0';
    pcVar35[0x39] = '\0';
    pcVar35[0x3a] = -0x80;
    pcVar35[0x3b] = -1;
    pcVar35[0x3c] = '\0';
    pcVar35[0x3d] = '\0';
    pcVar35[0x3e] = -0x80;
    pcVar35[0x3f] = -1;
    pcVar35[0x80] = '\0';
    pcVar35[0x81] = '\0';
    pcVar35[0x82] = '\0';
    pcVar35[0x83] = '\0';
    pcVar35[0x84] = '\0';
    pcVar35[0x85] = '\0';
    pcVar35[0x86] = '\0';
    pcVar35[0x87] = '\0';
    pcVar35[0x88] = '\0';
    pcVar35[0x89] = '\0';
    pcVar35[0x8a] = '\0';
    pcVar35[0x8b] = '\0';
    pcVar35[0x8c] = '\0';
    pcVar35[0x8d] = '\0';
    pcVar35[0x8e] = '\0';
    pcVar35[0x8f] = '\0';
    pcVar35[0x90] = '\0';
    pcVar35[0x91] = '\0';
    pcVar35[0x92] = '\0';
    pcVar35[0x93] = '\0';
    pcVar35[0x94] = '\0';
    pcVar35[0x95] = '\0';
    pcVar35[0x96] = '\0';
    pcVar35[0x97] = '\0';
    pcVar35[0x98] = '\0';
    pcVar35[0x99] = '\0';
    pcVar35[0x9a] = '\0';
    pcVar35[0x9b] = '\0';
    pcVar35[0x9c] = '\0';
    pcVar35[0x9d] = '\0';
    pcVar35[0x9e] = '\0';
    pcVar35[0x9f] = '\0';
    pcVar35[0xa0] = '\0';
    pcVar35[0xa1] = '\0';
    pcVar35[0xa2] = '\0';
    pcVar35[0xa3] = '\0';
    pcVar35[0xa4] = '\0';
    pcVar35[0xa5] = '\0';
    pcVar35[0xa6] = '\0';
    pcVar35[0xa7] = '\0';
    pcVar35[0xa8] = '\0';
    pcVar35[0xa9] = '\0';
    pcVar35[0xaa] = '\0';
    pcVar35[0xab] = '\0';
    pcVar35[0xac] = '\0';
    pcVar35[0xad] = '\0';
    pcVar35[0xae] = '\0';
    pcVar35[0xaf] = '\0';
    pcVar35[0xb0] = '\0';
    pcVar35[0xb1] = '\0';
    pcVar35[0xb2] = '\0';
    pcVar35[0xb3] = '\0';
    pcVar35[0xb4] = '\0';
    pcVar35[0xb5] = '\0';
    pcVar35[0xb6] = '\0';
    pcVar35[0xb7] = '\0';
    pcVar35[0xb8] = '\0';
    pcVar35[0xb9] = '\0';
    pcVar35[0xba] = '\0';
    pcVar35[0xbb] = '\0';
    pcVar35[0xbc] = '\0';
    pcVar35[0xbd] = '\0';
    pcVar35[0xbe] = '\0';
    pcVar35[0xbf] = '\0';
    pcVar35[0xc0] = '\0';
    pcVar35[0xc1] = '\0';
    pcVar35[0xc2] = '\0';
    pcVar35[0xc3] = '\0';
    pcVar35[0xc4] = '\0';
    pcVar35[0xc5] = '\0';
    pcVar35[0xc6] = '\0';
    pcVar35[199] = '\0';
    pcVar35[200] = '\0';
    pcVar35[0xc9] = '\0';
    pcVar35[0xca] = '\0';
    pcVar35[0xcb] = '\0';
    pcVar35[0xcc] = '\0';
    pcVar35[0xcd] = '\0';
    pcVar35[0xce] = '\0';
    pcVar35[0xcf] = '\0';
    pcVar35[0xd0] = '\0';
    pcVar35[0xd1] = '\0';
    pcVar35[0xd2] = '\0';
    pcVar35[0xd3] = '\0';
    pcVar35[0xd4] = '\0';
    pcVar35[0xd5] = '\0';
    pcVar35[0xd6] = '\0';
    pcVar35[0xd7] = '\0';
    pcVar35[0xd8] = '\0';
    pcVar35[0xd9] = '\0';
    pcVar35[0xda] = '\0';
    pcVar35[0xdb] = '\0';
    pcVar35[0xdc] = '\0';
    pcVar35[0xdd] = '\0';
    pcVar35[0xde] = '\0';
    pcVar35[0xdf] = '\0';
    for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
      pcVar4 = pcVar35 + lVar41 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
    }
    goto LAB_004d2f6c;
  }
  _reduction = (code *)&DAT_00000100;
  pTVar13 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
    vSplitPos.field_0.v[1]._0_1_ = 1;
    vSplitPos.field_0.v[0] = (longlong)pTVar13;
    MutexSys::lock(&pTVar13->mutex);
    if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar3 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
           ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar13->alloc0).bytesUsed = 0;
    (pTVar13->alloc0).bytesWasted = 0;
    (pTVar13->alloc0).end = 0;
    (pTVar13->alloc0).allocBlockSize = 0;
    (pTVar13->alloc0).ptr = (char *)0x0;
    (pTVar13->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar13->alloc1).bytesUsed = 0;
      (pTVar13->alloc1).bytesWasted = 0;
      (pTVar13->alloc1).end = 0;
      (pTVar13->alloc1).allocBlockSize = 0;
      (pTVar13->alloc1).ptr = (char *)0x0;
      (pTVar13->alloc1).cur = 0;
    }
    else {
      (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar13->alloc1).ptr = (char *)0x0;
      (pTVar13->alloc1).cur = 0;
      (pTVar13->alloc1).end = 0;
      (pTVar13->alloc1).allocBlockSize = 0;
      (pTVar13->alloc1).bytesUsed = 0;
      (pTVar13->alloc1).bytesWasted = 0;
      (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar13->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
    isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
    vSplitMask.field_0._0_8_ = pTVar13;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vSplitMask);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&isLeft);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vSplitPos);
  }
  (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + (long)_reduction);
  sVar38 = (alloc.talloc0)->cur;
  uVar36 = (ulong)(-(int)sVar38 & 0xf);
  puVar34 = (undefined1 *)(sVar38 + (long)_reduction) + uVar36;
  (alloc.talloc0)->cur = (size_t)puVar34;
  if ((undefined1 *)(alloc.talloc0)->end < puVar34) {
    (alloc.talloc0)->cur = sVar38;
    if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
      pcVar35 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
    }
    else {
      isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
      pcVar35 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
      (alloc.talloc0)->ptr = pcVar35;
      sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar38;
      (alloc.talloc0)->end = (size_t)isLeft.split;
      (alloc.talloc0)->cur = (size_t)_reduction;
      if (isLeft.split < _reduction) {
        (alloc.talloc0)->cur = 0;
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar35 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar35;
        sVar38 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar38;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          pcVar35 = (char *)0x0;
          goto LAB_004d2dc5;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar38;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar36;
    pcVar35 = (alloc.talloc0)->ptr + ((long)puVar34 - (long)_reduction);
  }
LAB_004d2dc5:
  pcVar35[0xe0] = '\0';
  pcVar35[0xe1] = '\0';
  pcVar35[0xe2] = -0x80;
  pcVar35[0xe3] = '\x7f';
  pcVar35[0xe4] = '\0';
  pcVar35[0xe5] = '\0';
  pcVar35[0xe6] = -0x80;
  pcVar35[0xe7] = '\x7f';
  pcVar35[0xe8] = '\0';
  pcVar35[0xe9] = '\0';
  pcVar35[0xea] = -0x80;
  pcVar35[0xeb] = '\x7f';
  pcVar35[0xec] = '\0';
  pcVar35[0xed] = '\0';
  pcVar35[0xee] = -0x80;
  pcVar35[0xef] = '\x7f';
  pcVar35[0xf0] = '\0';
  pcVar35[0xf1] = '\0';
  pcVar35[0xf2] = -0x80;
  pcVar35[0xf3] = -1;
  pcVar35[0xf4] = '\0';
  pcVar35[0xf5] = '\0';
  pcVar35[0xf6] = -0x80;
  pcVar35[0xf7] = -1;
  pcVar35[0xf8] = '\0';
  pcVar35[0xf9] = '\0';
  pcVar35[0xfa] = -0x80;
  pcVar35[0xfb] = -1;
  pcVar35[0xfc] = '\0';
  pcVar35[0xfd] = '\0';
  pcVar35[0xfe] = -0x80;
  pcVar35[0xff] = -1;
  pcVar35[0x60] = '\0';
  pcVar35[0x61] = '\0';
  pcVar35[0x62] = -0x80;
  pcVar35[99] = '\x7f';
  pcVar35[100] = '\0';
  pcVar35[0x65] = '\0';
  pcVar35[0x66] = -0x80;
  pcVar35[0x67] = '\x7f';
  pcVar35[0x68] = '\0';
  pcVar35[0x69] = '\0';
  pcVar35[0x6a] = -0x80;
  pcVar35[0x6b] = '\x7f';
  pcVar35[0x6c] = '\0';
  pcVar35[0x6d] = '\0';
  pcVar35[0x6e] = -0x80;
  pcVar35[0x6f] = '\x7f';
  pcVar35[0x40] = '\0';
  pcVar35[0x41] = '\0';
  pcVar35[0x42] = -0x80;
  pcVar35[0x43] = '\x7f';
  pcVar35[0x44] = '\0';
  pcVar35[0x45] = '\0';
  pcVar35[0x46] = -0x80;
  pcVar35[0x47] = '\x7f';
  pcVar35[0x48] = '\0';
  pcVar35[0x49] = '\0';
  pcVar35[0x4a] = -0x80;
  pcVar35[0x4b] = '\x7f';
  pcVar35[0x4c] = '\0';
  pcVar35[0x4d] = '\0';
  pcVar35[0x4e] = -0x80;
  pcVar35[0x4f] = '\x7f';
  pcVar35[0x20] = '\0';
  pcVar35[0x21] = '\0';
  pcVar35[0x22] = -0x80;
  pcVar35[0x23] = '\x7f';
  pcVar35[0x24] = '\0';
  pcVar35[0x25] = '\0';
  pcVar35[0x26] = -0x80;
  pcVar35[0x27] = '\x7f';
  pcVar35[0x28] = '\0';
  pcVar35[0x29] = '\0';
  pcVar35[0x2a] = -0x80;
  pcVar35[0x2b] = '\x7f';
  pcVar35[0x2c] = '\0';
  pcVar35[0x2d] = '\0';
  pcVar35[0x2e] = -0x80;
  pcVar35[0x2f] = '\x7f';
  pcVar35[0x70] = '\0';
  pcVar35[0x71] = '\0';
  pcVar35[0x72] = -0x80;
  pcVar35[0x73] = -1;
  pcVar35[0x74] = '\0';
  pcVar35[0x75] = '\0';
  pcVar35[0x76] = -0x80;
  pcVar35[0x77] = -1;
  pcVar35[0x78] = '\0';
  pcVar35[0x79] = '\0';
  pcVar35[0x7a] = -0x80;
  pcVar35[0x7b] = -1;
  pcVar35[0x7c] = '\0';
  pcVar35[0x7d] = '\0';
  pcVar35[0x7e] = -0x80;
  pcVar35[0x7f] = -1;
  pcVar35[0x50] = '\0';
  pcVar35[0x51] = '\0';
  pcVar35[0x52] = -0x80;
  pcVar35[0x53] = -1;
  pcVar35[0x54] = '\0';
  pcVar35[0x55] = '\0';
  pcVar35[0x56] = -0x80;
  pcVar35[0x57] = -1;
  pcVar35[0x58] = '\0';
  pcVar35[0x59] = '\0';
  pcVar35[0x5a] = -0x80;
  pcVar35[0x5b] = -1;
  pcVar35[0x5c] = '\0';
  pcVar35[0x5d] = '\0';
  pcVar35[0x5e] = -0x80;
  pcVar35[0x5f] = -1;
  pcVar35[0x30] = '\0';
  pcVar35[0x31] = '\0';
  pcVar35[0x32] = -0x80;
  pcVar35[0x33] = -1;
  pcVar35[0x34] = '\0';
  pcVar35[0x35] = '\0';
  pcVar35[0x36] = -0x80;
  pcVar35[0x37] = -1;
  pcVar35[0x38] = '\0';
  pcVar35[0x39] = '\0';
  pcVar35[0x3a] = -0x80;
  pcVar35[0x3b] = -1;
  pcVar35[0x3c] = '\0';
  pcVar35[0x3d] = '\0';
  pcVar35[0x3e] = -0x80;
  pcVar35[0x3f] = -1;
  pcVar35[0x80] = '\0';
  pcVar35[0x81] = '\0';
  pcVar35[0x82] = '\0';
  pcVar35[0x83] = '\0';
  pcVar35[0x84] = '\0';
  pcVar35[0x85] = '\0';
  pcVar35[0x86] = '\0';
  pcVar35[0x87] = '\0';
  pcVar35[0x88] = '\0';
  pcVar35[0x89] = '\0';
  pcVar35[0x8a] = '\0';
  pcVar35[0x8b] = '\0';
  pcVar35[0x8c] = '\0';
  pcVar35[0x8d] = '\0';
  pcVar35[0x8e] = '\0';
  pcVar35[0x8f] = '\0';
  pcVar35[0x90] = '\0';
  pcVar35[0x91] = '\0';
  pcVar35[0x92] = '\0';
  pcVar35[0x93] = '\0';
  pcVar35[0x94] = '\0';
  pcVar35[0x95] = '\0';
  pcVar35[0x96] = '\0';
  pcVar35[0x97] = '\0';
  pcVar35[0x98] = '\0';
  pcVar35[0x99] = '\0';
  pcVar35[0x9a] = '\0';
  pcVar35[0x9b] = '\0';
  pcVar35[0x9c] = '\0';
  pcVar35[0x9d] = '\0';
  pcVar35[0x9e] = '\0';
  pcVar35[0x9f] = '\0';
  pcVar35[0xa0] = '\0';
  pcVar35[0xa1] = '\0';
  pcVar35[0xa2] = '\0';
  pcVar35[0xa3] = '\0';
  pcVar35[0xa4] = '\0';
  pcVar35[0xa5] = '\0';
  pcVar35[0xa6] = '\0';
  pcVar35[0xa7] = '\0';
  pcVar35[0xa8] = '\0';
  pcVar35[0xa9] = '\0';
  pcVar35[0xaa] = '\0';
  pcVar35[0xab] = '\0';
  pcVar35[0xac] = '\0';
  pcVar35[0xad] = '\0';
  pcVar35[0xae] = '\0';
  pcVar35[0xaf] = '\0';
  pcVar35[0xb0] = '\0';
  pcVar35[0xb1] = '\0';
  pcVar35[0xb2] = '\0';
  pcVar35[0xb3] = '\0';
  pcVar35[0xb4] = '\0';
  pcVar35[0xb5] = '\0';
  pcVar35[0xb6] = '\0';
  pcVar35[0xb7] = '\0';
  pcVar35[0xb8] = '\0';
  pcVar35[0xb9] = '\0';
  pcVar35[0xba] = '\0';
  pcVar35[0xbb] = '\0';
  pcVar35[0xbc] = '\0';
  pcVar35[0xbd] = '\0';
  pcVar35[0xbe] = '\0';
  pcVar35[0xbf] = '\0';
  pcVar35[0xc0] = '\0';
  pcVar35[0xc1] = '\0';
  pcVar35[0xc2] = '\0';
  pcVar35[0xc3] = '\0';
  pcVar35[0xc4] = '\0';
  pcVar35[0xc5] = '\0';
  pcVar35[0xc6] = '\0';
  pcVar35[199] = '\0';
  pcVar35[200] = '\0';
  pcVar35[0xc9] = '\0';
  pcVar35[0xca] = '\0';
  pcVar35[0xcb] = '\0';
  pcVar35[0xcc] = '\0';
  pcVar35[0xcd] = '\0';
  pcVar35[0xce] = '\0';
  pcVar35[0xcf] = '\0';
  pcVar35[0xd0] = '\0';
  pcVar35[0xd1] = '\0';
  pcVar35[0xd2] = '\0';
  pcVar35[0xd3] = '\0';
  pcVar35[0xd4] = '\0';
  pcVar35[0xd5] = '\0';
  pcVar35[0xd6] = '\0';
  pcVar35[0xd7] = '\0';
  pcVar35[0xd8] = '\0';
  pcVar35[0xd9] = '\0';
  pcVar35[0xda] = '\0';
  pcVar35[0xdb] = '\0';
  pcVar35[0xdc] = '\0';
  pcVar35[0xdd] = '\0';
  pcVar35[0xde] = '\0';
  pcVar35[0xdf] = '\0';
  local_18f0 = 6;
  for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
    pcVar4 = pcVar35 + lVar41 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
  }
LAB_004d2f6c:
  sVar38 = children.numChildren;
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_PrimInfoMB.object_range._end -
      (current->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
    vSplitPos.field_0.v[0] = sVar38;
    vSplitPos.field_0.v[1] = 0;
    local_1748._0_8_ = 1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHBuilderMSMBlur::BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::UserGeometry,embree::Object>,embree::Scene::BuildProgressMonitorInterface>::recurse(embree::sse2::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHBuilderMSMBlur::BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::UserGeometry,embree::Object>,embree::Scene::BuildProgressMonitorInterface>::recurse(embree::sse2::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
               (task_group_context *)&isLeft);
    cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar22 != '\0') {
      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar28,"task cancelled");
      __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    paVar30 = &values[0].lbounds.bounds1.upper.field_0;
    local_19e8 = _DAT_01f45a40;
    _local_1a48 = _DAT_01f45a30;
    sVar38 = children.numChildren;
    local_1a28 = _DAT_01f45a40;
    _local_1a38 = _DAT_01f45a30;
    while (bVar44 = sVar38 != 0, sVar38 = sVar38 - 1, local_1988._0_8_ = &children, bVar44) {
      _local_1a38 = minps(_local_1a38,(undefined1  [16])paVar30[-3]);
      local_1a28 = maxps(local_1a28,(undefined1  [16])paVar30[-2]);
      _local_1a48 = minps(_local_1a48,*(undefined1 (*) [16])&paVar30[-1].field_1.x);
      local_19e8 = maxps(local_19e8,(undefined1  [16])*paVar30);
      paVar30 = paVar30 + 6;
    }
  }
  else {
    current_00 = children.children.items + children.numChildren;
    pBVar37 = &values[children.numChildren - 1].dt;
    local_1a28._8_8_ = 0xff800000ff800000;
    local_1a28._0_8_ = 0xff800000ff800000;
    uStack_1a30 = 0x7f8000007f800000;
    local_1a38 = (undefined1  [8])0x7f8000007f800000;
    while( true ) {
      sVar38 = sVar38 - 1;
      current_00 = current_00 + -1;
      if ((long)sVar38 < 0) break;
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      recurse((NodeRecordMB4D *)&isLeft,this,current_00,alloc_01,false);
      pBVar37[-10] = (BBox1f)isLeft.split;
      auVar18._8_8_ = uStack_18d0;
      auVar18._0_8_ = isLeft.vSplitMask;
      *(undefined1 (*) [16])(pBVar37 + -8) = auVar18;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar37 + -6) = local_18c8;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar37 + -4) = local_18b8;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar37 + -2) = local_18a8;
      pBVar37->lower = (float)local_1898._0_4_;
      pBVar37->upper = local_1898.m128[1];
      _local_1a38 = minps(_local_1a38,auVar18);
      local_1a28 = maxps(local_1a28,(undefined1  [16])local_18c8);
      _local_1a48 = minps(_local_1a48,(undefined1  [16])local_18b8);
      local_19e8 = maxps(local_19e8,(undefined1  [16])local_18a8);
      pBVar37 = pBVar37 + -0xc;
    }
  }
  auVar21 = _DAT_01f4b860;
  auVar18 = _DAT_01f4b850;
  local_18f0 = local_18f0 | (ulong)pcVar35;
  uVar36 = (ulong)pcVar35 & 0xfffffffffffffff0;
  if (((uint)local_18f0 & 0xf) == 1) {
    pfVar31 = &values[0].dt.upper;
    for (sVar38 = 0; children.numChildren != sVar38; sVar38 = sVar38 + 1) {
      *(undefined8 *)(uVar36 + sVar38 * 8) = *(undefined8 *)(pfVar31 + -0x15);
      fVar59 = ((BBox1f *)(pfVar31 + -1))->lower;
      fVar49 = 1.0 / (*pfVar31 - fVar59);
      fVar50 = -fVar59 * fVar49;
      fVar48 = 1.0 - fVar50;
      auVar55._0_4_ = pfVar31[-0x11] * fVar48 + pfVar31[-9] * fVar50;
      auVar55._4_4_ = pfVar31[-0x10] * fVar48 + pfVar31[-8] * fVar50;
      auVar55._8_4_ = pfVar31[-0xf] * fVar48 + pfVar31[-7] * fVar50;
      auVar55._12_4_ = pfVar31[-0xe] * fVar48 + pfVar31[-6] * fVar50;
      auVar57._0_4_ = fVar48 * pfVar31[-0xd] + fVar50 * pfVar31[-5];
      auVar57._4_4_ = fVar48 * pfVar31[-0xc] + fVar50 * pfVar31[-4];
      auVar57._8_4_ = fVar48 * pfVar31[-0xb] + fVar50 * pfVar31[-3];
      auVar57._12_4_ = fVar48 * pfVar31[-10] + fVar50 * pfVar31[-2];
      fVar49 = (1.0 - fVar59) * fVar49;
      fVar59 = 1.0 - fVar49;
      auVar53._0_4_ = pfVar31[-0x11] * fVar59 + pfVar31[-9] * fVar49;
      auVar53._4_4_ = pfVar31[-0x10] * fVar59 + pfVar31[-8] * fVar49;
      auVar53._8_4_ = pfVar31[-0xf] * fVar59 + pfVar31[-7] * fVar49;
      auVar53._12_4_ = pfVar31[-0xe] * fVar59 + pfVar31[-6] * fVar49;
      auVar60._0_4_ = fVar59 * pfVar31[-0xd] + fVar49 * pfVar31[-5];
      auVar60._4_4_ = fVar59 * pfVar31[-0xc] + fVar49 * pfVar31[-4];
      auVar60._8_4_ = fVar59 * pfVar31[-0xb] + fVar49 * pfVar31[-3];
      auVar60._12_4_ = fVar59 * pfVar31[-10] + fVar49 * pfVar31[-2];
      auVar56 = minps(auVar55,auVar21);
      auVar58 = maxps(auVar57,auVar18);
      auVar54 = minps(auVar53,auVar21);
      auVar61 = maxps(auVar60,auVar18);
      fVar59 = auVar56._0_4_ - ABS(auVar56._0_4_) * 4.7683716e-07;
      fVar48 = auVar56._4_4_ - ABS(auVar56._4_4_) * 4.7683716e-07;
      fVar49 = auVar56._8_4_ - ABS(auVar56._8_4_) * 4.7683716e-07;
      fVar50 = ABS(auVar58._0_4_) * 4.7683716e-07 + auVar58._0_4_;
      fVar51 = ABS(auVar58._4_4_) * 4.7683716e-07 + auVar58._4_4_;
      fVar52 = ABS(auVar58._8_4_) * 4.7683716e-07 + auVar58._8_4_;
      *(float *)(uVar36 + 0x20 + sVar38 * 4) = fVar59;
      *(float *)(uVar36 + 0x40 + sVar38 * 4) = fVar48;
      *(float *)(uVar36 + 0x60 + sVar38 * 4) = fVar49;
      *(float *)(uVar36 + 0x30 + sVar38 * 4) = fVar50;
      *(float *)(uVar36 + 0x50 + sVar38 * 4) = fVar51;
      *(float *)(uVar36 + 0x70 + sVar38 * 4) = fVar52;
      *(float *)(uVar36 + 0x80 + sVar38 * 4) =
           (auVar54._0_4_ - ABS(auVar54._0_4_) * 4.7683716e-07) - fVar59;
      *(float *)(uVar36 + 0xa0 + sVar38 * 4) =
           (auVar54._4_4_ - ABS(auVar54._4_4_) * 4.7683716e-07) - fVar48;
      *(float *)(uVar36 + 0xc0 + sVar38 * 4) =
           (auVar54._8_4_ - ABS(auVar54._8_4_) * 4.7683716e-07) - fVar49;
      *(float *)(uVar36 + 0x90 + sVar38 * 4) =
           (ABS(auVar61._0_4_) * 4.7683716e-07 + auVar61._0_4_) - fVar50;
      *(float *)(uVar36 + 0xb0 + sVar38 * 4) =
           (ABS(auVar61._4_4_) * 4.7683716e-07 + auVar61._4_4_) - fVar51;
      *(float *)(uVar36 + 0xd0 + sVar38 * 4) =
           (ABS(auVar61._8_4_) * 4.7683716e-07 + auVar61._8_4_) - fVar52;
      pfVar31 = pfVar31 + 0x18;
    }
  }
  else {
    pfVar31 = &values[0].dt.upper;
    for (sVar38 = 0; children.numChildren != sVar38; sVar38 = sVar38 + 1) {
      *(undefined8 *)(uVar36 + sVar38 * 8) = *(undefined8 *)(pfVar31 + -0x15);
      fVar59 = ((BBox1f *)(pfVar31 + -1))->lower;
      fVar49 = 1.0 / (*pfVar31 - fVar59);
      fVar50 = -fVar59 * fVar49;
      fVar48 = 1.0 - fVar50;
      auVar56._0_4_ = pfVar31[-0x11] * fVar48 + pfVar31[-9] * fVar50;
      auVar56._4_4_ = pfVar31[-0x10] * fVar48 + pfVar31[-8] * fVar50;
      auVar56._8_4_ = pfVar31[-0xf] * fVar48 + pfVar31[-7] * fVar50;
      auVar56._12_4_ = pfVar31[-0xe] * fVar48 + pfVar31[-6] * fVar50;
      auVar58._0_4_ = fVar48 * pfVar31[-0xd] + fVar50 * pfVar31[-5];
      auVar58._4_4_ = fVar48 * pfVar31[-0xc] + fVar50 * pfVar31[-4];
      auVar58._8_4_ = fVar48 * pfVar31[-0xb] + fVar50 * pfVar31[-3];
      auVar58._12_4_ = fVar48 * pfVar31[-10] + fVar50 * pfVar31[-2];
      fVar49 = (1.0 - fVar59) * fVar49;
      fVar59 = 1.0 - fVar49;
      auVar54._0_4_ = pfVar31[-0x11] * fVar59 + pfVar31[-9] * fVar49;
      auVar54._4_4_ = pfVar31[-0x10] * fVar59 + pfVar31[-8] * fVar49;
      auVar54._8_4_ = pfVar31[-0xf] * fVar59 + pfVar31[-7] * fVar49;
      auVar54._12_4_ = pfVar31[-0xe] * fVar59 + pfVar31[-6] * fVar49;
      auVar61._0_4_ = fVar59 * pfVar31[-0xd] + fVar49 * pfVar31[-5];
      auVar61._4_4_ = fVar59 * pfVar31[-0xc] + fVar49 * pfVar31[-4];
      auVar61._8_4_ = fVar59 * pfVar31[-0xb] + fVar49 * pfVar31[-3];
      auVar61._12_4_ = fVar59 * pfVar31[-10] + fVar49 * pfVar31[-2];
      auVar56 = minps(auVar56,auVar21);
      auVar58 = maxps(auVar58,auVar18);
      auVar54 = minps(auVar54,auVar21);
      auVar61 = maxps(auVar61,auVar18);
      fVar59 = auVar56._0_4_ - ABS(auVar56._0_4_) * 4.7683716e-07;
      fVar48 = auVar56._4_4_ - ABS(auVar56._4_4_) * 4.7683716e-07;
      fVar49 = auVar56._8_4_ - ABS(auVar56._8_4_) * 4.7683716e-07;
      fVar50 = ABS(auVar58._0_4_) * 4.7683716e-07 + auVar58._0_4_;
      fVar51 = ABS(auVar58._4_4_) * 4.7683716e-07 + auVar58._4_4_;
      fVar52 = ABS(auVar58._8_4_) * 4.7683716e-07 + auVar58._8_4_;
      *(float *)(uVar36 + 0x20 + sVar38 * 4) = fVar59;
      *(float *)(uVar36 + 0x40 + sVar38 * 4) = fVar48;
      *(float *)(uVar36 + 0x60 + sVar38 * 4) = fVar49;
      *(float *)(uVar36 + 0x30 + sVar38 * 4) = fVar50;
      *(float *)(uVar36 + 0x50 + sVar38 * 4) = fVar51;
      *(float *)(uVar36 + 0x70 + sVar38 * 4) = fVar52;
      *(float *)(uVar36 + 0x80 + sVar38 * 4) =
           (auVar54._0_4_ - ABS(auVar54._0_4_) * 4.7683716e-07) - fVar59;
      *(float *)(uVar36 + 0xa0 + sVar38 * 4) =
           (auVar54._4_4_ - ABS(auVar54._4_4_) * 4.7683716e-07) - fVar48;
      *(float *)(uVar36 + 0xc0 + sVar38 * 4) =
           (auVar54._8_4_ - ABS(auVar54._8_4_) * 4.7683716e-07) - fVar49;
      *(float *)(uVar36 + 0x90 + sVar38 * 4) =
           (ABS(auVar61._0_4_) * 4.7683716e-07 + auVar61._0_4_) - fVar50;
      *(float *)(uVar36 + 0xb0 + sVar38 * 4) =
           (ABS(auVar61._4_4_) * 4.7683716e-07 + auVar61._4_4_) - fVar51;
      *(float *)(uVar36 + 0xd0 + sVar38 * 4) =
           (ABS(auVar61._8_4_) * 4.7683716e-07 + auVar61._8_4_) - fVar52;
      *(float *)(uVar36 + 0xe0 + sVar38 * 4) = ((BBox1f *)(pfVar31 + -1))->lower;
      uVar46 = -(uint)(*pfVar31 == 1.0);
      *(uint *)(uVar36 + 0xf0 + sVar38 * 4) = ~uVar46 & (uint)*pfVar31 | uVar46 & 0x3f800001;
      pfVar31 = pfVar31 + 0x18;
    }
  }
  if (bVar45) {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    pSVar14 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pPVar15 = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)
              (current->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.v[1] = 0x7f8000007f800000;
    local_1748._0_8_ = 0xff800000ff800000;
    local_1748._8_8_ = 0xff800000ff800000;
    local_1738._0_8_ = 0x7f8000007f800000;
    local_1738._8_8_ = 0x7f8000007f800000;
    local_1728[0]._0_8_ = 0xff800000ff800000;
    local_1728[0]._8_8_ = 0xff800000ff800000;
    vSplitPos_1.field_0.v[0] = (longlong)set;
    if ((ulong)((long)pPVar15 - (long)pSVar14) < 0xc00) {
      isLeft.split = pSVar14;
      isLeft.vSplitPos = (vint *)pPVar15;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
      _reduction2 = &time_range0;
      _reduction = (code *)pPVar15;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,(task_group_context *)this);
      cVar22 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar22 != '\0') {
        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar28,"task cancelled");
        __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    }
    (__return_storage_ptr__->ref).ptr = local_18f0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1988._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1988._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1978._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1978._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1968._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1968._8_8_;
    BVar25 = (current->prims).super_PrimInfoMB.time_range;
  }
  else {
    (__return_storage_ptr__->ref).ptr = local_18f0;
    *(undefined1 (*) [8])&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1a38;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         uStack_1a30;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1a28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1a28._8_8_;
    *(undefined1 (*) [8])&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1a48;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         uStack_1a40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_19e8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_19e8._8_8_;
    BVar25 = (current->prims).super_PrimInfoMB.time_range;
  }
  __return_storage_ptr__->dt = BVar25;
  for (uVar36 = 0; uVar36 < children.numChildren; uVar36 = uVar36 + 1) {
    pSVar11 = children.primvecs.items[uVar36];
    psVar2 = &pSVar11->refCount;
    *psVar2 = *psVar2 - 1;
    if (*psVar2 == 0) {
      pvVar29 = pSVar11->prims;
      if (pvVar29 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar38 = pvVar29->size_alloced;
        pPVar9 = pvVar29->items;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar38 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar38 * 0x50,(pvVar29->alloc).hugepages);
          }
        }
        if (sVar38 != 0) {
          pMVar10 = (pvVar29->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar38 * -0x50,1);
        }
        pvVar29->size_active = 0;
        pvVar29->size_alloced = 0;
        pvVar29->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar29);
    }
  }
  std::
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ::~unique_ptr(&new_vector);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }